

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O1

Array<asl::File> __thiscall asl::Directory::items(Directory *this,String *which,ItemType t)

{
  String *this_00;
  Endian *pEVar1;
  char *__s1;
  uint n;
  Array<asl::File> AVar2;
  File *pFVar3;
  bool bVar4;
  int iVar5;
  anon_union_16_2_78e7fdac_for_String_2 *paVar6;
  dirent *pdVar7;
  size_t sVar8;
  int in_ECX;
  undefined4 in_register_00000014;
  String *this_01;
  byte bVar9;
  undefined8 uVar10;
  anon_union_16_2_78e7fdac_for_String_2 *__name;
  anon_union_16_2_78e7fdac_for_String_2 *paVar11;
  bool bVar12;
  String dir;
  String name;
  FileInfo info;
  stat data;
  String local_198;
  String local_180;
  File *local_168;
  DIR *local_160;
  FileInfo local_158;
  String local_138;
  String local_120;
  undefined1 local_108 [72];
  stat local_c0;
  
  this_01 = (String *)CONCAT44(in_register_00000014,t);
  this_00 = which + 1;
  local_168 = (File *)this;
  Array<asl::File>::resize((Array<asl::File> *)this_00,0);
  paVar11 = &which->field_2;
  paVar6 = paVar11;
  if (which->_size != 0) {
    paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(which->field_2)._str;
  }
  __name = (anon_union_16_2_78e7fdac_for_String_2 *)0x142de9;
  if (paVar6->_space[0] != '\0') {
    __name = paVar6;
  }
  local_160 = opendir(__name->_space);
  if (local_160 == (DIR *)0x0) {
    AVar2._a = *(File **)this_00;
    local_168->_file = (FILE *)AVar2._a;
    LOCK();
    pEVar1 = &AVar2._a[-1]._endian;
    *pEVar1 = *pEVar1 + ENDIAN_LITTLE;
    UNLOCK();
    return (Array<asl::File>)local_168;
  }
  n = which->_len;
  if (0 < (int)n) {
    paVar6 = paVar11;
    if (which->_size != 0) {
      paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(which->field_2)._str;
    }
    if (paVar6->_space[(ulong)n - 1] == '/') {
      String::alloc(&local_198,n);
      uVar10 = local_198.field_2._str;
      if (local_198._size == 0) {
        uVar10 = &local_198.field_2;
      }
      if (which->_size != 0) {
        paVar11 = (anon_union_16_2_78e7fdac_for_String_2 *)(which->field_2)._str;
      }
      local_198._len = n;
      memcpy((void *)uVar10,paVar11,(ulong)n + 1);
      goto LAB_001366e7;
    }
  }
  local_c0.st_dev._0_1_ = 0x2f;
  String::concat(&local_198,which,(char *)&local_c0,1);
LAB_001366e7:
  local_180.field_2._space[0] = '\0';
  local_180._size = 0;
  local_180._len = 0;
  iVar5 = String::indexOf(this_01,'*',0);
  if (iVar5 < 0) {
    bVar12 = false;
  }
  else {
    if (this_01->_size == 0) {
      paVar11 = &this_01->field_2;
    }
    else {
      paVar11 = (anon_union_16_2_78e7fdac_for_String_2 *)(this_01->field_2)._str;
    }
    iVar5 = strcmp(paVar11->_space,"*");
    bVar12 = iVar5 != 0;
  }
  do {
    pdVar7 = readdir(local_160);
    if (pdVar7 == (dirent *)0x0) break;
    if (bVar12) {
      String::String(&local_138,pdVar7->d_name);
      iVar5 = String::indexOf(this_01,'*',0);
      if (iVar5 == -1) {
        bVar4 = String::operator==(&local_138,this_01);
      }
      else {
        String::substring((String *)local_108,this_01,0,iVar5);
        bVar4 = String::startsWith(&local_138,(String *)local_108);
        if (bVar4) {
          String::substring(&local_120,this_01,iVar5 + 1,this_01->_len);
          bVar4 = String::endsWith(&local_138,&local_120);
          if (local_120._size != 0) {
            free(local_120.field_2._str);
          }
        }
        else {
          bVar4 = false;
        }
        if (local_108._0_4_ != 0) {
          free((void *)local_108._8_8_);
        }
      }
      bVar9 = bVar4 ^ 1;
    }
    else {
      bVar9 = 0;
    }
    if ((bVar12) && (local_138._size != 0)) {
      free(local_138.field_2._str);
    }
    if (bVar9 == 0) {
      __s1 = pdVar7->d_name;
      iVar5 = strcmp(__s1,".");
      if ((iVar5 != 0) && (iVar5 = strcmp(__s1,".."), iVar5 != 0)) {
        uVar10 = &local_198.field_2;
        if (local_198._size != 0) {
          uVar10 = local_198.field_2._str;
        }
        String::assign(&local_180,(char *)uVar10,local_198._len);
        sVar8 = strlen(__s1);
        String::append(&local_180,__s1,(int)sVar8);
        paVar11 = &local_180.field_2;
        if (local_180._size != 0) {
          paVar11 = (anon_union_16_2_78e7fdac_for_String_2 *)
                    CONCAT71(local_180.field_2._1_7_,local_180.field_2._space[0]);
        }
        iVar5 = stat(paVar11->_space,&local_c0);
        if (iVar5 == 0) {
          if (in_ECX == 0) {
            if ((local_c0.st_mode & 0xf000) != 0x4000) goto LAB_0013692f;
          }
          else if ((in_ECX != 1) || ((local_c0.st_mode & 0xf000) == 0x4000)) {
LAB_0013692f:
            local_158.lastModified._t = (double)local_c0.st_mtim.tv_sec;
            local_158.creationDate._t = (double)local_c0.st_ctim.tv_sec;
            local_158.size = local_c0.st_size;
            local_158.flags = local_c0.st_mode;
            File::File((File *)local_108,&local_180,&local_158);
            Array<asl::File>::insert((Array<asl::File> *)this_00,-1,(File *)local_108);
            File::~File((File *)local_108);
          }
        }
      }
    }
  } while (pdVar7 != (dirent *)0x0);
  closedir(local_160);
  pFVar3 = local_168;
  AVar2._a = *(File **)this_00;
  local_168->_file = (FILE *)AVar2._a;
  LOCK();
  pEVar1 = &AVar2._a[-1]._endian;
  *pEVar1 = *pEVar1 + ENDIAN_LITTLE;
  UNLOCK();
  if (local_180._size != 0) {
    free((void *)CONCAT71(local_180.field_2._1_7_,local_180.field_2._space[0]));
  }
  if (local_198._size != 0) {
    free(local_198.field_2._str);
  }
  return (Array<asl::File>)pFVar3;
}

Assistant:

Array<File> Directory::items(const String& which, Directory::ItemType t)
{
	_files.clear();
	DIR* d = opendir(_path != ""? *_path : "/");
	if(!d)
		return _files;
	String dir = _path.endsWith('/')? _path : (_path+'/');
	String name;
	bool wildcard = which.contains('*') && which != "*";
	
	while(dirent* entry=readdir(d))
	{
		struct stat data;
		if(wildcard && !match(entry->d_name, which))
			continue;
		if(!strcmp(entry->d_name, ".") || !strcmp(entry->d_name, ".."))
			continue;
		name = dir;
		name += (const char*)entry->d_name;
		if(!stat(name, &data)) {
			if( (t==DIRE && !S_ISDIR(data.st_mode)) ||
				(t==FILE && S_ISDIR(data.st_mode)) )
				continue;
			_files << File(name, infoFor(data));
		}
	}
	closedir(d);
	return _files;
}